

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

uint __thiscall
QXmlStreamReaderPrivate::resolveCharRef(QXmlStreamReaderPrivate *this,int symbolIndex)

{
  long lVar1;
  Value *pVVar2;
  int in_ESI;
  QXmlStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  uint s;
  bool ok;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  bool bVar3;
  undefined1 in_stack_ffffffffffffff87;
  uint local_70;
  QXmlStreamReaderPrivate *pQVar4;
  int index;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  pVVar2 = sym(in_RDI,in_ESI);
  index = (int)((ulong)pQVar4 >> 0x20);
  if (pVVar2->c == 0x78) {
    symString(in_stack_ffffffffffffffa0,index,(int)pQVar4);
    QtPrivate::XmlStringRef::view((XmlStringRef *)in_RDI);
    local_70 = QStringView::toUInt((QStringView *)in_RDI,
                                   (bool *)CONCAT17(in_stack_ffffffffffffff87,
                                                    CONCAT16(in_stack_ffffffffffffff86,
                                                             CONCAT24(in_stack_ffffffffffffff84,
                                                                      in_stack_ffffffffffffff80))),
                                   in_stack_ffffffffffffff7c);
  }
  else {
    symString(in_stack_ffffffffffffffa0,index);
    QtPrivate::XmlStringRef::view((XmlStringRef *)in_RDI);
    local_70 = QStringView::toUInt((QStringView *)in_RDI,
                                   (bool *)CONCAT17(in_stack_ffffffffffffff87,
                                                    CONCAT16(in_stack_ffffffffffffff86,
                                                             CONCAT24(in_stack_ffffffffffffff84,
                                                                      in_stack_ffffffffffffff80))),
                                   in_stack_ffffffffffffff7c);
  }
  bVar3 = true;
  if ((((local_70 != 9) && (bVar3 = true, local_70 != 10)) && (bVar3 = true, local_70 != 0xd)) &&
     (((local_70 < 0x20 || (bVar3 = true, 0xd7ff < local_70)) &&
      ((local_70 < 0xe000 || (bVar3 = true, 0xfffd < local_70)))))) {
    bVar3 = 0xffff < local_70 && local_70 < 0x110000;
  }
  if (!bVar3) {
    local_70 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_70;
  }
  __stack_chk_fail();
}

Assistant:

uint QXmlStreamReaderPrivate::resolveCharRef(int symbolIndex)
{
    bool ok = true;
    uint s;
    // ### add toXShort to XmlString?
    if (sym(symbolIndex).c == 'x')
        s = symString(symbolIndex, 1).view().toUInt(&ok, 16);
    else
        s = symString(symbolIndex).view().toUInt(&ok, 10);

    ok &= (s == 0x9 || s == 0xa || s == 0xd || (s >= 0x20 && s <= 0xd7ff)
           || (s >= 0xe000 && s <= 0xfffd) || (s >= 0x10000 && s <= QChar::LastValidCodePoint));

    return ok ? s : 0;
}